

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Vector<LLVMBC::BasicBlock_*> * __thiscall
dxil_spv::Converter::Impl::build_function_bb_visit_order_analysis
          (Vector<LLVMBC::BasicBlock_*> *__return_storage_ptr__,Impl *this,Function *func)

{
  BasicBlock *bb;
  iterator __first;
  iterator __last;
  BasicBlock *entry;
  undefined1 local_58 [8];
  UnorderedSet<LLVMBC::BasicBlock_*> visited;
  Function *func_local;
  Impl *this_local;
  Vector<LLVMBC::BasicBlock_*> *visit_order;
  
  visited._M_h._M_single_bucket = (__node_base_ptr)func;
  if (func == (Function *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::vector
              (__return_storage_ptr__);
  }
  else {
    std::
    unordered_set<LLVMBC::BasicBlock_*,_std::hash<LLVMBC::BasicBlock_*>,_std::equal_to<LLVMBC::BasicBlock_*>,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
    ::unordered_set((unordered_set<LLVMBC::BasicBlock_*,_std::hash<LLVMBC::BasicBlock_*>,_std::equal_to<LLVMBC::BasicBlock_*>,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                     *)local_58);
    std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::vector
              (__return_storage_ptr__);
    bb = LLVMBC::Function::getEntryBlock((Function *)visited._M_h._M_single_bucket);
    build_function_bb_visit_order_inner_analysis
              (this,__return_storage_ptr__,(UnorderedSet<LLVMBC::BasicBlock_*> *)local_58,bb);
    __first = std::
              vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
              begin(__return_storage_ptr__);
    __last = std::
             vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
             end(__return_storage_ptr__);
    std::
    reverse<__gnu_cxx::__normal_iterator<LLVMBC::BasicBlock**,std::vector<LLVMBC::BasicBlock*,dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock*>>>>
              ((__normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
                )__first._M_current,
               (__normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
                )__last._M_current);
    std::
    unordered_set<LLVMBC::BasicBlock_*,_std::hash<LLVMBC::BasicBlock_*>,_std::equal_to<LLVMBC::BasicBlock_*>,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
    ::~unordered_set((unordered_set<LLVMBC::BasicBlock_*,_std::hash<LLVMBC::BasicBlock_*>,_std::equal_to<LLVMBC::BasicBlock_*>,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                      *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<llvm::BasicBlock *> Converter::Impl::build_function_bb_visit_order_analysis(llvm::Function *func)
{
	if (!func)
		return {};

	UnorderedSet<llvm::BasicBlock *> visited;
	Vector<llvm::BasicBlock *> visit_order;
	auto *entry = &func->getEntryBlock();
	build_function_bb_visit_order_inner_analysis(visit_order, visited, entry);
	// Get natural traverse order, input is post-traversal order.
	std::reverse(visit_order.begin(), visit_order.end());
	return visit_order;
}